

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cVertexAttribBindingTests.cpp
# Opt level: O2

long __thiscall glcts::anon_unknown_0::BasicInputICase1::Run(BasicInputICase1 *this)

{
  CallLogWrapper *this_00;
  IVec4 *pIVar1;
  UVec4 *pUVar2;
  long lVar3;
  GLuint i;
  GLuint index;
  int iVar4;
  bool bVar5;
  GLbyte d [4];
  QueryType QStack_44;
  
  this_00 = &(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
             super_GLWrapper.super_CallLogWrapper;
  index = 0;
  iVar4 = 8;
  while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
    glu::CallLogWrapper::glVertexAttribI4i(this_00,index,0,0,0,0);
    glu::CallLogWrapper::glVertexAttribI4ui(this_00,index | 8,0,0,0,0);
    index = index + 1;
  }
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vbo);
  glu::CallLogWrapper::glBufferData(this_00,0x8892,0xb0,(void *)0x0,0x88e4);
  _d = CONCAT44(QStack_44,0xfc03fe01);
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0,4,d);
  _d = 0xfff80007fffa0005;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,4,8,d);
  _d = 0xfffffff600000009;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0xc,0x10,d);
  _d = CONCAT44(QStack_44,0x100f0e0d);
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0x1c,4,d);
  _d = 0x14001300120011;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0x20,8,d);
  d[0] = '\x15';
  d[1] = '\0';
  d[2] = '\0';
  d[3] = '\0';
  QStack_44 = QUERY_TEXTURE_PARAM_FLOAT;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0x28,0x10,d);
  _d = 0xffffffa50000005a;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0x38,0x10,d);
  _d = 0x5f0000005e;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0x48,0x10,d);
  _d = CONCAT44(QStack_44,0xe41be619);
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0x58,4,d);
  _d = 0xffe0001fffe2001d;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0x5c,8,d);
  _d = 0xffffffde00000021;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,100,0x10,d);
  _d = CONCAT44(QStack_44,0x28272625);
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0x74,4,d);
  _d = 0x2c002b002a0029;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0x78,8,d);
  _d = 0x2e0000002d;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0x80,0x10,d);
  _d = 0xffffff9d00000062;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0x90,0x10,d);
  _d = 0x6700000066;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0xa0,0x10,d);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
  glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao);
  glu::CallLogWrapper::glVertexAttribIFormat(this_00,0,1,0x1400,0);
  glu::CallLogWrapper::glVertexAttribIFormat(this_00,1,2,0x1402,4);
  glu::CallLogWrapper::glVertexAttribIFormat(this_00,2,3,0x1404,0xc);
  glu::CallLogWrapper::glVertexAttribIFormat(this_00,3,4,0x1404,0x38);
  glu::CallLogWrapper::glVertexAttribIFormat(this_00,8,3,0x1401,0x1c);
  glu::CallLogWrapper::glVertexAttribIFormat(this_00,9,2,0x1403,0x20);
  glu::CallLogWrapper::glVertexAttribIFormat(this_00,10,1,0x1405,0x28);
  glu::CallLogWrapper::glVertexAttribIFormat(this_00,0xb,4,0x1405,0x48);
  glu::CallLogWrapper::glVertexAttribBinding(this_00,0,0);
  glu::CallLogWrapper::glVertexAttribBinding(this_00,1,0);
  glu::CallLogWrapper::glVertexAttribBinding(this_00,2,0);
  glu::CallLogWrapper::glVertexAttribBinding(this_00,3,0);
  glu::CallLogWrapper::glVertexAttribBinding(this_00,8,0);
  glu::CallLogWrapper::glVertexAttribBinding(this_00,9,0);
  glu::CallLogWrapper::glVertexAttribBinding(this_00,10,0);
  glu::CallLogWrapper::glVertexAttribBinding(this_00,0xb,0);
  glu::CallLogWrapper::glBindVertexBuffer(this_00,0,this->m_vbo,0,0x58);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,1);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,2);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,3);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,8);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,9);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,10);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0xb);
  (this->super_BasicInputIBase).expected_datai[0].m_data[0] = 1;
  (this->super_BasicInputIBase).expected_datai[0].m_data[1] = 0;
  (this->super_BasicInputIBase).expected_datai[0].m_data[2] = 0;
  (this->super_BasicInputIBase).expected_datai[0].m_data[3] = 1;
  (this->super_BasicInputIBase).expected_datai[1].m_data[0] = 5;
  (this->super_BasicInputIBase).expected_datai[1].m_data[1] = -6;
  pIVar1 = (this->super_BasicInputIBase).expected_datai;
  pIVar1[1].m_data[2] = 0;
  pIVar1[1].m_data[3] = 1;
  (this->super_BasicInputIBase).expected_datai[2].m_data[0] = 9;
  (this->super_BasicInputIBase).expected_datai[2].m_data[1] = -10;
  pIVar1 = (this->super_BasicInputIBase).expected_datai;
  pIVar1[2].m_data[2] = 0xb;
  pIVar1[2].m_data[3] = 1;
  (this->super_BasicInputIBase).expected_datai[3].m_data[0] = 0x5a;
  (this->super_BasicInputIBase).expected_datai[3].m_data[1] = -0x5b;
  pIVar1 = (this->super_BasicInputIBase).expected_datai;
  pIVar1[3].m_data[2] = 0x5c;
  pIVar1[3].m_data[3] = -0x5d;
  (this->super_BasicInputIBase).expected_dataui[0].m_data[0] = 0xd;
  (this->super_BasicInputIBase).expected_dataui[0].m_data[1] = 0xe;
  (this->super_BasicInputIBase).expected_dataui[0].m_data[2] = 0xf;
  (this->super_BasicInputIBase).expected_dataui[0].m_data[3] = 1;
  (this->super_BasicInputIBase).expected_dataui[1].m_data[0] = 0x11;
  (this->super_BasicInputIBase).expected_dataui[1].m_data[1] = 0x12;
  pUVar2 = (this->super_BasicInputIBase).expected_dataui;
  pUVar2[1].m_data[2] = 0;
  pUVar2[1].m_data[3] = 1;
  (this->super_BasicInputIBase).expected_dataui[2].m_data[0] = 0x15;
  (this->super_BasicInputIBase).expected_dataui[2].m_data[1] = 0;
  pUVar2 = (this->super_BasicInputIBase).expected_dataui;
  pUVar2[2].m_data[2] = 0;
  pUVar2[2].m_data[3] = 1;
  (this->super_BasicInputIBase).expected_dataui[3].m_data[0] = 0x5e;
  (this->super_BasicInputIBase).expected_dataui[3].m_data[1] = 0x5f;
  pUVar2 = (this->super_BasicInputIBase).expected_dataui;
  pUVar2[3].m_data[2] = 0x60;
  pUVar2[3].m_data[3] = 0x61;
  (this->super_BasicInputIBase).expected_datai[8].m_data[0] = 0x19;
  (this->super_BasicInputIBase).expected_datai[8].m_data[1] = 0;
  pIVar1 = (this->super_BasicInputIBase).expected_datai;
  pIVar1[8].m_data[2] = 0;
  pIVar1[8].m_data[3] = 1;
  (this->super_BasicInputIBase).expected_datai[9].m_data[0] = 0x1d;
  (this->super_BasicInputIBase).expected_datai[9].m_data[1] = -0x1e;
  pIVar1 = (this->super_BasicInputIBase).expected_datai;
  pIVar1[9].m_data[2] = 0;
  pIVar1[9].m_data[3] = 1;
  (this->super_BasicInputIBase).expected_datai[10].m_data[0] = 0x21;
  (this->super_BasicInputIBase).expected_datai[10].m_data[1] = -0x22;
  pIVar1 = (this->super_BasicInputIBase).expected_datai;
  pIVar1[10].m_data[2] = 0x23;
  pIVar1[10].m_data[3] = 1;
  (this->super_BasicInputIBase).expected_datai[0xb].m_data[0] = 0x62;
  (this->super_BasicInputIBase).expected_datai[0xb].m_data[1] = -99;
  pIVar1 = (this->super_BasicInputIBase).expected_datai;
  pIVar1[0xb].m_data[2] = 100;
  pIVar1[0xb].m_data[3] = -0x65;
  (this->super_BasicInputIBase).expected_dataui[8].m_data[0] = 0x25;
  (this->super_BasicInputIBase).expected_dataui[8].m_data[1] = 0x26;
  pUVar2 = (this->super_BasicInputIBase).expected_dataui;
  pUVar2[8].m_data[2] = 0x27;
  pUVar2[8].m_data[3] = 1;
  (this->super_BasicInputIBase).expected_dataui[9].m_data[0] = 0x29;
  (this->super_BasicInputIBase).expected_dataui[9].m_data[1] = 0x2a;
  pUVar2 = (this->super_BasicInputIBase).expected_dataui;
  pUVar2[9].m_data[2] = 0;
  pUVar2[9].m_data[3] = 1;
  (this->super_BasicInputIBase).expected_dataui[10].m_data[0] = 0x2d;
  (this->super_BasicInputIBase).expected_dataui[10].m_data[1] = 0;
  pUVar2 = (this->super_BasicInputIBase).expected_dataui;
  pUVar2[10].m_data[2] = 0;
  pUVar2[10].m_data[3] = 1;
  (this->super_BasicInputIBase).expected_dataui[0xb].m_data[0] = 0x66;
  (this->super_BasicInputIBase).expected_dataui[0xb].m_data[1] = 0x67;
  pUVar2 = (this->super_BasicInputIBase).expected_dataui;
  pUVar2[0xb].m_data[2] = 0x68;
  pUVar2[0xb].m_data[3] = 0x69;
  lVar3 = BasicInputIBase::Run(&this->super_BasicInputIBase);
  return lVar3;
}

Assistant:

virtual long Run()
	{
		for (GLuint i = 0; i < 8; ++i)
		{
			glVertexAttribI4i(i, 0, 0, 0, 0);
			glVertexAttribI4ui(i + 8, 0, 0, 0, 0);
		}
		const int kStride = 88;
		glBindBuffer(GL_ARRAY_BUFFER, m_vbo);
		glBufferData(GL_ARRAY_BUFFER, kStride * 2, NULL, GL_STATIC_DRAW);
		/* */
		{
			GLbyte d[] = { 1, -2, 3, -4 };
			glBufferSubData(GL_ARRAY_BUFFER, 0, sizeof(d), d);
		}
		/* */
		{
			GLshort d[] = { 5, -6, 7, -8 };
			glBufferSubData(GL_ARRAY_BUFFER, 4, sizeof(d), d);
		}
		/* */
		{
			GLint d[] = { 9, -10, 11, -12 };
			glBufferSubData(GL_ARRAY_BUFFER, 12, sizeof(d), d);
		}
		/* */
		{
			GLubyte d[] = { 13, 14, 15, 16 };
			glBufferSubData(GL_ARRAY_BUFFER, 28, sizeof(d), d);
		}
		/* */
		{
			GLushort d[] = { 17, 18, 19, 20 };
			glBufferSubData(GL_ARRAY_BUFFER, 32, sizeof(d), d);
		}
		/* */
		{
			GLuint d[] = { 21, 22, 23, 24 };
			glBufferSubData(GL_ARRAY_BUFFER, 40, sizeof(d), d);
		}
		/* */
		{
			GLint d[] = { 90, -91, 92, -93 };
			glBufferSubData(GL_ARRAY_BUFFER, 56, sizeof(d), d);
		}
		/* */
		{
			GLuint d[] = { 94, 95, 96, 97 };
			glBufferSubData(GL_ARRAY_BUFFER, 72, sizeof(d), d);
		}

		/* */
		{
			GLbyte d[] = { 25, -26, 27, -28 };
			glBufferSubData(GL_ARRAY_BUFFER, 0 + kStride, sizeof(d), d);
		}
		/* */
		{
			GLshort d[] = { 29, -30, 31, -32 };
			glBufferSubData(GL_ARRAY_BUFFER, 4 + kStride, sizeof(d), d);
		}
		/* */
		{
			GLint d[] = { 33, -34, 35, -36 };
			glBufferSubData(GL_ARRAY_BUFFER, 12 + kStride, sizeof(d), d);
		}
		/* */
		{
			GLubyte d[] = { 37, 38, 39, 40 };
			glBufferSubData(GL_ARRAY_BUFFER, 28 + kStride, sizeof(d), d);
		}
		/* */
		{
			GLushort d[] = { 41, 42, 43, 44 };
			glBufferSubData(GL_ARRAY_BUFFER, 32 + kStride, sizeof(d), d);
		}
		/* */
		{
			GLuint d[] = { 45, 46, 47, 48 };
			glBufferSubData(GL_ARRAY_BUFFER, 40 + kStride, sizeof(d), d);
		}
		/* */
		{
			GLint d[] = { 98, -99, 100, -101 };
			glBufferSubData(GL_ARRAY_BUFFER, 56 + kStride, sizeof(d), d);
		}
		/* */
		{
			GLuint d[] = { 102, 103, 104, 105 };
			glBufferSubData(GL_ARRAY_BUFFER, 72 + kStride, sizeof(d), d);
		}
		glBindBuffer(GL_ARRAY_BUFFER, 0);

		glBindVertexArray(m_vao);
		glVertexAttribIFormat(0, 1, GL_BYTE, 0);
		glVertexAttribIFormat(1, 2, GL_SHORT, 4);
		glVertexAttribIFormat(2, 3, GL_INT, 12);
		glVertexAttribIFormat(3, 4, GL_INT, 56);
		glVertexAttribIFormat(8, 3, GL_UNSIGNED_BYTE, 28);
		glVertexAttribIFormat(9, 2, GL_UNSIGNED_SHORT, 32);
		glVertexAttribIFormat(10, 1, GL_UNSIGNED_INT, 40);
		glVertexAttribIFormat(11, 4, GL_UNSIGNED_INT, 72);
		glVertexAttribBinding(0, 0);
		glVertexAttribBinding(1, 0);
		glVertexAttribBinding(2, 0);
		glVertexAttribBinding(3, 0);
		glVertexAttribBinding(8, 0);
		glVertexAttribBinding(9, 0);
		glVertexAttribBinding(10, 0);
		glVertexAttribBinding(11, 0);
		glBindVertexBuffer(0, m_vbo, 0, kStride);
		glEnableVertexAttribArray(0);
		glEnableVertexAttribArray(1);
		glEnableVertexAttribArray(2);
		glEnableVertexAttribArray(3);
		glEnableVertexAttribArray(8);
		glEnableVertexAttribArray(9);
		glEnableVertexAttribArray(10);
		glEnableVertexAttribArray(11);

		expected_datai[0]   = IVec4(1, 0, 0, 1);
		expected_datai[1]   = IVec4(5, -6, 0, 1);
		expected_datai[2]   = IVec4(9, -10, 11, 1);
		expected_datai[3]   = IVec4(90, -91, 92, -93);
		expected_dataui[0]  = UVec4(13, 14, 15, 1);
		expected_dataui[1]  = UVec4(17, 18, 0, 1);
		expected_dataui[2]  = UVec4(21, 0, 0, 1);
		expected_dataui[3]  = UVec4(94, 95, 96, 97);
		expected_datai[8]   = IVec4(25, 0, 0, 1);
		expected_datai[9]   = IVec4(29, -30, 0, 1);
		expected_datai[10]  = IVec4(33, -34, 35, 1);
		expected_datai[11]  = IVec4(98, -99, 100, -101);
		expected_dataui[8]  = UVec4(37, 38, 39, 1);
		expected_dataui[9]  = UVec4(41, 42, 0, 1);
		expected_dataui[10] = UVec4(45, 0, 0, 1);
		expected_dataui[11] = UVec4(102, 103, 104, 105);
		return BasicInputIBase::Run();
	}